

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

Ses_Man_t *
Ses_ManAlloc(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int fMakeAIG,
            int nBTLimit,int fVerbose)

{
  int iVar1;
  Ses_Man_t *pSes;
  Vec_Int_t *pVVar2;
  int *local_48;
  Ses_Man_t *p;
  int local_30;
  int i;
  int h;
  int fMakeAIG_local;
  int *pArrTimeProfile_local;
  int nMaxDepth_local;
  int nFunc_local;
  int nVars_local;
  word *pTruth_local;
  
  pSes = (Ses_Man_t *)calloc(1,0x488);
  pSes->pSat = (sat_solver *)0x0;
  pSes->bSpecInv = 0;
  for (local_30 = 0; local_30 < nFunc; local_30 = local_30 + 1) {
    if ((pTruth[local_30 << 2] & 1) != 0) {
      for (p._4_4_ = 0; p._4_4_ < 4; p._4_4_ = p._4_4_ + 1) {
        pTruth[local_30 * 4 + p._4_4_] = pTruth[local_30 * 4 + p._4_4_] ^ 0xffffffffffffffff;
      }
      pSes->bSpecInv = 1 << ((byte)local_30 & 0x1f) | pSes->bSpecInv;
    }
  }
  pSes->pSpec = pTruth;
  pSes->nSpecVars = nVars;
  pSes->nSpecFunc = nFunc;
  iVar1 = Abc_TtWordNum(nVars);
  pSes->nSpecWords = iVar1;
  pSes->nRows = (1 << ((byte)nVars & 0x1f)) + -1;
  pSes->nMaxDepth = nMaxDepth;
  local_48 = pArrTimeProfile;
  if (nMaxDepth < 0) {
    local_48 = (int *)0x0;
  }
  pSes->pArrTimeProfile = local_48;
  if (pSes->pArrTimeProfile == (int *)0x0) {
    pSes->nArrTimeMax = 0;
    pSes->nArrTimeDelta = 0;
  }
  else {
    iVar1 = Abc_NormalizeArrivalTimes(pSes->pArrTimeProfile,nVars,&pSes->nArrTimeMax);
    pSes->nArrTimeDelta = iVar1;
  }
  pSes->fMakeAIG = fMakeAIG;
  pSes->nBTLimit = nBTLimit;
  pSes->fVerbose = fVerbose;
  pSes->fVeryVerbose = 0;
  pSes->fExtractVerbose = 0;
  pSes->fSatVerbose = 0;
  pVVar2 = Vec_IntAlloc(100);
  pSes->vPolar = pVVar2;
  pVVar2 = Vec_IntAlloc(10);
  pSes->vAssump = pVVar2;
  pVVar2 = Vec_IntAlloc(nVars);
  pSes->vStairDecVars = pVVar2;
  pSes->nRandRowAssigns = nVars << 1;
  pSes->fKeepRowAssigns = 0;
  if (pSes->nSpecFunc == 1) {
    Ses_ManComputeTopDec(pSes);
  }
  srand(0xcafe);
  return pSes;
}

Assistant:

static inline Ses_Man_t * Ses_ManAlloc( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int fMakeAIG, int nBTLimit, int fVerbose )
{
    int h, i;

    Ses_Man_t * p = ABC_CALLOC( Ses_Man_t, 1 );
    p->pSat       = NULL;
    p->bSpecInv   = 0;
    for ( h = 0; h < nFunc; ++h )
        if ( pTruth[h << 2] & 1 )
        {
            for ( i = 0; i < 4; ++i )
                pTruth[(h << 2) + i] = ~pTruth[(h << 2) + i];
            p->bSpecInv |= ( 1 << h );
        }
    p->pSpec           = pTruth;
    p->nSpecVars       = nVars;
    p->nSpecFunc       = nFunc;
    p->nSpecWords      = Abc_TtWordNum( nVars );
    p->nRows           = ( 1 << nVars ) - 1;
    p->nMaxDepth       = nMaxDepth;
    p->pArrTimeProfile = nMaxDepth >= 0 ? pArrTimeProfile : NULL;
    if ( p->pArrTimeProfile )
        p->nArrTimeDelta = Abc_NormalizeArrivalTimes( p->pArrTimeProfile, nVars, &p->nArrTimeMax );
    else
        p->nArrTimeDelta = p->nArrTimeMax = 0;
    p->fMakeAIG        = fMakeAIG;
    p->nBTLimit        = nBTLimit;
    p->fVerbose        = fVerbose;
    p->fVeryVerbose    = 0;
    p->fExtractVerbose = 0;
    p->fSatVerbose     = 0;
    p->vPolar          = Vec_IntAlloc( 100 );
    p->vAssump         = Vec_IntAlloc( 10 );
    p->vStairDecVars   = Vec_IntAlloc( nVars );
    p->nRandRowAssigns = 2 * nVars;
    p->fKeepRowAssigns = 0;

    if ( p->nSpecFunc == 1 )
        Ses_ManComputeTopDec( p );

    srand( 0xCAFE );

    return p;
}